

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O0

iterator __thiscall
QNetworkAuthenticationCache::findClosestMatch(QNetworkAuthenticationCache *this,QString *domain)

{
  bool bVar1;
  iterator iVar2;
  QNetworkAuthenticationCredential *pQVar3;
  ulong uVar4;
  iterator in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  QList<QNetworkAuthenticationCredential> *in_stack_ffffffffffffffa0;
  iterator local_18;
  QNetworkAuthenticationCredential *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.i = (QNetworkAuthenticationCredential *)0xaaaaaaaaaaaaaaaa;
  iVar2 = QList<QNetworkAuthenticationCredential>::begin(in_stack_ffffffffffffffa0);
  QList<QNetworkAuthenticationCredential>::end(in_stack_ffffffffffffffa0);
  local_18 = std::lower_bound<QList<QNetworkAuthenticationCredential>::iterator,QString>
                       (in_RSI,iVar2,in_RDI);
  iVar2 = QList<QNetworkAuthenticationCredential>::end(in_stack_ffffffffffffffa0);
  bVar1 = QList<QNetworkAuthenticationCredential>::iterator::operator==(&local_18,iVar2);
  if ((bVar1) &&
     (bVar1 = QList<QNetworkAuthenticationCredential>::isEmpty
                        ((QList<QNetworkAuthenticationCredential> *)0x183966), !bVar1)) {
    QList<QNetworkAuthenticationCredential>::iterator::operator--(&local_18);
  }
  iVar2 = QList<QNetworkAuthenticationCredential>::end(in_stack_ffffffffffffffa0);
  bVar1 = QList<QNetworkAuthenticationCredential>::iterator::operator==(&local_18,iVar2);
  if (!bVar1) {
    pQVar3 = QList<QNetworkAuthenticationCredential>::iterator::operator->(&local_18);
    uVar4 = QString::startsWith((QString *)in_RSI.i,(CaseSensitivity)pQVar3);
    if ((uVar4 & 1) != 0) {
      local_10 = local_18.i;
      goto LAB_001839e3;
    }
  }
  local_10 = (QNetworkAuthenticationCredential *)
             QList<QNetworkAuthenticationCredential>::end(in_stack_ffffffffffffffa0);
LAB_001839e3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (iterator)local_10;
}

Assistant:

iterator findClosestMatch(const QString &domain)
    {
        iterator it = std::lower_bound(begin(), end(), domain);
        if (it == end() && !isEmpty())
            --it;
        if (it == end() || !domain.startsWith(it->domain))
            return end();
        return it;
    }